

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::RgbaInputFile::setLayerName(RgbaInputFile *this,string *layerName)

{
  RgbaChannels RVar1;
  InputFile *pIVar2;
  undefined8 in_RSI;
  InputPart *in_RDI;
  FromYca *unaff_retaddr;
  FrameBuffer fb;
  RgbaChannels rgbaChannels;
  FrameBuffer *in_stack_ffffffffffffff58;
  RgbaInputFile *in_stack_ffffffffffffff60;
  InputPart *pIVar3;
  FromYca *in_stack_ffffffffffffff70;
  InputPart local_78;
  Header *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  string local_30 [36];
  RgbaChannels rgbaChannels_00;
  
  rgbaChannels_00 = (RgbaChannels)((ulong)in_RSI >> 0x20);
  pIVar2 = in_RDI[3].file;
  pIVar3 = in_RDI;
  if (pIVar2 != (InputFile *)0x0) {
    FromYca::~FromYca(in_stack_ffffffffffffff70);
    operator_delete(pIVar2,0x188);
  }
  in_RDI[3].file = (InputFile *)0x0;
  InputPart::header((InputPart *)0x2228cf);
  anon_unknown_1::prefixFromLayerName(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::__cxx11::string::operator=((string *)(in_RDI + 4),local_30);
  std::__cxx11::string::~string(local_30);
  RVar1 = channels(in_stack_ffffffffffffff60);
  if ((RVar1 & WRITE_C) != 0) {
    pIVar2 = (InputFile *)operator_new(0x188);
    FromYca::FromYca(unaff_retaddr,pIVar3,rgbaChannels_00);
    in_RDI[3].file = pIVar2;
  }
  pIVar3 = &local_78;
  FrameBuffer::FrameBuffer((FrameBuffer *)0x22297f);
  InputPart::setFrameBuffer(pIVar3,in_stack_ffffffffffffff58);
  FrameBuffer::~FrameBuffer((FrameBuffer *)0x22299e);
  return;
}

Assistant:

void
RgbaInputFile::setLayerName (const string& layerName)
{
    delete _fromYca;
    _fromYca = nullptr;

    _channelNamePrefix = prefixFromLayerName (layerName, _inputPart->header ());

    RgbaChannels rgbaChannels = channels ();

    if (rgbaChannels & WRITE_C)
        _fromYca = new FromYca (*_inputPart, rgbaChannels);

    FrameBuffer fb;
    _inputPart->setFrameBuffer (fb);
}